

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ParseContext::
ParseContext<std::basic_string_view<char,std::char_traits<char>>&>
          (ParseContext *this,int depth,bool aliasing,char **start,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  string_view flat;
  char *pcVar1;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  char **start_local;
  bool aliasing_local;
  int depth_local;
  ParseContext *this_local;
  
  EpsCopyInputStream::EpsCopyInputStream(&this->super_EpsCopyInputStream,aliasing);
  this->depth_ = depth;
  this->group_depth_ = -0x80000000;
  Data::Data(&this->data_);
  flat._M_len = args->_M_len;
  flat._M_str = args->_M_str;
  pcVar1 = EpsCopyInputStream::InitFrom(&this->super_EpsCopyInputStream,flat);
  *start = pcVar1;
  return;
}

Assistant:

ParseContext(int depth, bool aliasing, const char** start, T&&... args)
      : EpsCopyInputStream(aliasing), depth_(depth) {
    *start = InitFrom(std::forward<T>(args)...);
  }